

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiWindow *pIVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ImGuiWindowSettings *pIVar6;
  ulong uVar7;
  
  uVar3 = (ctx->Windows).Size;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      if ((long)(int)uVar3 <= (long)uVar7) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                      ,0x52e,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar1 = (ctx->Windows).Data[uVar7];
      if ((pIVar1->Flags & 0x100) == 0) {
        uVar3 = pIVar1->SettingsOffset;
        if ((ulong)uVar3 == 0xffffffff) {
          pIVar6 = ImGui::FindWindowSettings(pIVar1->ID);
        }
        else {
          if (((int)uVar3 < 4) || ((ctx->SettingsWindows).Buf.Size <= (int)uVar3)) {
            __assert_fail("off >= 4 && off < Buf.Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_internal.h"
                          ,0x201,
                          "T *ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(int) [T = ImGuiWindowSettings]"
                         );
          }
          pIVar6 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + uVar3);
        }
        if (pIVar6 == (ImGuiWindowSettings *)0x0) {
          pIVar6 = ImGui::CreateNewWindowSettings(pIVar1->Name);
          iVar4 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&ctx->SettingsWindows,pIVar6);
          pIVar1->SettingsOffset = iVar4;
        }
        if (pIVar6->ID != pIVar1->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                        ,0x26d1,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar6->Pos = (ImVec2ih)((int)(pIVar1->Pos).x & 0xffffU | (int)(pIVar1->Pos).y << 0x10);
        pIVar6->Size = (ImVec2ih)
                       ((int)(pIVar1->SizeFull).x & 0xffffU | (int)(pIVar1->SizeFull).y << 0x10);
        pIVar6->Collapsed = pIVar1->Collapsed;
        uVar3 = (ctx->Windows).Size;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  iVar4 = (buf->Buf).Size;
  iVar5 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar5 = 0;
  }
  ImGuiTextBuffer::reserve(buf,iVar5 + (ctx->SettingsWindows).Buf.Size * 6);
  pcVar2 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar6 = (ImGuiWindowSettings *)(pcVar2 + 4);
    do {
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar6 + 1);
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar6->Pos).x,
                 (ulong)(uint)(int)(pIVar6->Pos).y);
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar6->Size).x,
                 (ulong)(uint)(int)(pIVar6->Size).y);
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar6->Collapsed);
      ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      pIVar6 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar6);
    } while (pIVar6 != (ImGuiWindowSettings *)0x0);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}